

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

string * __thiscall
google::protobuf::Message::GetTypeName_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)(*(long *)(CONCAT44(extraout_var,iVar1) + 8) + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string Message::GetTypeName() const {
  return GetDescriptor()->full_name();
}